

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderCodeVariableDescX::SetDefaultTypeName
          (ShaderCodeVariableDescX *this,SHADER_SOURCE_LANGUAGE Language)

{
  SHADER_SOURCE_LANGUAGE in_stack_ffffffffffffffb8;
  string local_38;
  SHADER_SOURCE_LANGUAGE local_14;
  ShaderCodeVariableDescX *pSStack_10;
  SHADER_SOURCE_LANGUAGE Language_local;
  ShaderCodeVariableDescX *this_local;
  
  local_14 = Language;
  pSStack_10 = this;
  GetShaderCodeTypeName_abi_cxx11_
            (&local_38,(Diligent *)(ulong)(this->super_ShaderCodeVariableDesc).BasicType,
             (this->super_ShaderCodeVariableDesc).Class,(this->super_ShaderCodeVariableDesc).NumRows
             ,(uint)(this->super_ShaderCodeVariableDesc).NumColumns,Language,
             in_stack_ffffffffffffffb8);
  SetTypeName(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SetDefaultTypeName(SHADER_SOURCE_LANGUAGE Language)
    {
        SetTypeName(GetShaderCodeTypeName(BasicType, Class, NumRows, NumColumns, Language));
    }